

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateState.cpp
# Opt level: O0

string * helics::fedStateString_abi_cxx11_(FederateStates state)

{
  int iVar1;
  undefined1 in_DIL;
  allocator<char> *in_stack_ffffffffffffffd0;
  char *in_stack_ffffffffffffffd8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffe0;
  allocator<char> local_a;
  undefined1 local_9;
  string *local_8;
  
  local_9 = in_DIL;
  if ((fedStateString[abi:cxx11](helics::FederateStates)::created_abi_cxx11_ == '\0') &&
     (iVar1 = __cxa_guard_acquire(&fedStateString[abi:cxx11](helics::FederateStates)::
                                   created_abi_cxx11_), iVar1 != 0)) {
    in_stack_ffffffffffffffd0 = &local_a;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
    std::allocator<char>::~allocator((allocator<char> *)&local_a);
    __cxa_atexit(std::__cxx11::string::~string,
                 &fedStateString[abi:cxx11](helics::FederateStates)::created_abi_cxx11_,
                 &__dso_handle);
    __cxa_guard_release(&fedStateString[abi:cxx11](helics::FederateStates)::created_abi_cxx11_);
  }
  if ((fedStateString[abi:cxx11](helics::FederateStates)::estate_abi_cxx11_ == '\0') &&
     (iVar1 = __cxa_guard_acquire(&fedStateString[abi:cxx11](helics::FederateStates)::
                                   estate_abi_cxx11_), iVar1 != 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffe3);
    __cxa_atexit(std::__cxx11::string::~string,
                 &fedStateString[abi:cxx11](helics::FederateStates)::estate_abi_cxx11_,&__dso_handle
                );
    __cxa_guard_release(&fedStateString[abi:cxx11](helics::FederateStates)::estate_abi_cxx11_);
  }
  if ((fedStateString[abi:cxx11](helics::FederateStates)::init_abi_cxx11_ == '\0') &&
     (iVar1 = __cxa_guard_acquire(&fedStateString[abi:cxx11](helics::FederateStates)::
                                   init_abi_cxx11_), iVar1 != 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffe2);
    __cxa_atexit(std::__cxx11::string::~string,
                 &fedStateString[abi:cxx11](helics::FederateStates)::init_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&fedStateString[abi:cxx11](helics::FederateStates)::init_abi_cxx11_);
  }
  if ((fedStateString[abi:cxx11](helics::FederateStates)::dis_abi_cxx11_ == '\0') &&
     (iVar1 = __cxa_guard_acquire(&fedStateString[abi:cxx11](helics::FederateStates)::dis_abi_cxx11_
                                 ), iVar1 != 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffe1);
    __cxa_atexit(std::__cxx11::string::~string,
                 &fedStateString[abi:cxx11](helics::FederateStates)::dis_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&fedStateString[abi:cxx11](helics::FederateStates)::dis_abi_cxx11_);
  }
  if ((fedStateString[abi:cxx11](helics::FederateStates)::exec_abi_cxx11_ == '\0') &&
     (iVar1 = __cxa_guard_acquire(&fedStateString[abi:cxx11](helics::FederateStates)::
                                   exec_abi_cxx11_), iVar1 != 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffe0);
    __cxa_atexit(std::__cxx11::string::~string,
                 &fedStateString[abi:cxx11](helics::FederateStates)::exec_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&fedStateString[abi:cxx11](helics::FederateStates)::exec_abi_cxx11_);
  }
  if ((fedStateString[abi:cxx11](helics::FederateStates)::term_abi_cxx11_ == '\0') &&
     (iVar1 = __cxa_guard_acquire(&fedStateString[abi:cxx11](helics::FederateStates)::
                                   term_abi_cxx11_), iVar1 != 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffdf);
    __cxa_atexit(std::__cxx11::string::~string,
                 &fedStateString[abi:cxx11](helics::FederateStates)::term_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&fedStateString[abi:cxx11](helics::FederateStates)::term_abi_cxx11_);
  }
  if ((fedStateString[abi:cxx11](helics::FederateStates)::unk_abi_cxx11_ == '\0') &&
     (iVar1 = __cxa_guard_acquire(&fedStateString[abi:cxx11](helics::FederateStates)::unk_abi_cxx11_
                                 ), iVar1 != 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffde);
    __cxa_atexit(std::__cxx11::string::~string,
                 &fedStateString[abi:cxx11](helics::FederateStates)::unk_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&fedStateString[abi:cxx11](helics::FederateStates)::unk_abi_cxx11_);
  }
  switch(local_9) {
  case 0:
    local_8 = &fedStateString[abi:cxx11](helics::FederateStates)::created_abi_cxx11_;
    break;
  case 1:
    local_8 = &fedStateString[abi:cxx11](helics::FederateStates)::init_abi_cxx11_;
    break;
  case 2:
    local_8 = &fedStateString[abi:cxx11](helics::FederateStates)::exec_abi_cxx11_;
    break;
  case 3:
    local_8 = &fedStateString[abi:cxx11](helics::FederateStates)::term_abi_cxx11_;
    break;
  case 4:
    local_8 = &fedStateString[abi:cxx11](helics::FederateStates)::estate_abi_cxx11_;
    break;
  case 5:
    local_8 = &fedStateString[abi:cxx11](helics::FederateStates)::dis_abi_cxx11_;
    break;
  case 6:
  default:
    local_8 = &fedStateString[abi:cxx11](helics::FederateStates)::unk_abi_cxx11_;
  }
  return local_8;
}

Assistant:

const std::string& fedStateString(FederateStates state)
{
    static const std::string created{"created"};
    static const std::string estate{"error"};
    static const std::string init{"initializing"};
    static const std::string dis{"disconnected"};
    static const std::string exec{"executing"};
    static const std::string term{"terminating"};
    static const std::string unk{"unknown"};

    switch (state) {
        case FederateStates::CREATED:
            return created;
        case FederateStates::INITIALIZING:
            return init;
        case FederateStates::EXECUTING:
            return exec;
        case FederateStates::TERMINATING:
            return term;
        case FederateStates::FINISHED:
            return dis;
        case FederateStates::ERRORED:
            return estate;
        case FederateStates::UNKNOWN:
        default:
            return unk;
    }
}